

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_compress_fast_continue
              (LZ4_stream_t *LZ4_stream,char *source,char *dest,int inputSize,int maxOutputSize,
              int acceleration)

{
  longlong lVar1;
  longlong lVar2;
  U32 UVar3;
  U32 UVar4;
  U32 UVar5;
  uint uVar6;
  uint uVar7;
  BYTE *pBVar8;
  BYTE *pBVar9;
  char *pcVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  bool bVar13;
  int local_4a0;
  int local_49c;
  int result_1;
  int result;
  BYTE *sourceEnd;
  BYTE *smallest;
  BYTE *dictEnd;
  LZ4_stream_t_internal *streamPtr;
  int acceleration_local;
  int maxOutputSize_local;
  int inputSize_local;
  char *dest_local;
  char *source_local;
  LZ4_stream_t *LZ4_stream_local;
  char *local_448;
  size_t accumulator_3;
  size_t lastRun_3;
  BYTE *pBStack_430;
  uint more_3;
  BYTE *limit_3;
  uint matchLength_3;
  int len_3;
  uint litLength_3;
  U32 h_3;
  uint searchMatchNb_3;
  uint step_3;
  BYTE *forwardIp_3;
  BYTE *token_3;
  BYTE *match_3;
  size_t refDelta_3;
  U32 forwardH_3;
  BYTE *olimit_3;
  BYTE *op_3;
  BYTE *matchlimit_3;
  BYTE *mflimit_3;
  BYTE *iend_3;
  BYTE *anchor_3;
  size_t dictDelta_3;
  BYTE *dictEnd_4;
  BYTE *dictionary_3;
  BYTE *lowRefLimit_3;
  BYTE *lowLimit_3;
  BYTE *base_3;
  BYTE *ip_3;
  LZ4_stream_t_internal *dictPtr_3;
  int local_33c;
  char *local_338;
  size_t accumulator_2;
  size_t lastRun_2;
  BYTE *pBStack_320;
  uint more_2;
  BYTE *limit_2;
  uint matchLength_2;
  int len_2;
  uint litLength_2;
  U32 h_2;
  uint searchMatchNb_2;
  uint step_2;
  BYTE *forwardIp_2;
  BYTE *token_2;
  BYTE *match_2;
  size_t refDelta_2;
  U32 forwardH_2;
  BYTE *olimit_2;
  BYTE *op_2;
  BYTE *matchlimit_2;
  BYTE *mflimit_2;
  BYTE *iend_2;
  BYTE *anchor_2;
  size_t dictDelta_2;
  BYTE *dictEnd_3;
  BYTE *dictionary_2;
  BYTE *lowRefLimit_2;
  BYTE *lowLimit_2;
  BYTE *base_2;
  BYTE *ip_2;
  LZ4_stream_t_internal *dictPtr_2;
  int local_22c;
  char *local_228;
  size_t accumulator_1;
  size_t lastRun_1;
  uint more_1;
  BYTE *limit_1;
  uint matchLength_1;
  int len_1;
  uint litLength_1;
  U32 h_1;
  uint searchMatchNb_1;
  uint step_1;
  BYTE *forwardIp_1;
  BYTE *token_1;
  BYTE *match_1;
  size_t refDelta_1;
  U32 forwardH_1;
  BYTE *olimit_1;
  BYTE *op_1;
  BYTE *matchlimit_1;
  BYTE *mflimit_1;
  BYTE *iend_1;
  BYTE *anchor_1;
  size_t dictDelta_1;
  BYTE *dictEnd_2;
  BYTE *dictionary_1;
  BYTE *lowRefLimit_1;
  BYTE *lowLimit_1;
  BYTE *base_1;
  BYTE *ip_1;
  LZ4_stream_t_internal *dictPtr_1;
  int local_11c;
  char *local_118;
  size_t accumulator;
  size_t lastRun;
  uint more;
  BYTE *limit;
  uint matchLength;
  int len;
  uint litLength;
  U32 h;
  uint searchMatchNb;
  uint step;
  BYTE *forwardIp;
  BYTE *token;
  BYTE *match;
  size_t refDelta;
  U32 forwardH;
  BYTE *olimit;
  BYTE *op;
  BYTE *matchlimit;
  BYTE *mflimit;
  BYTE *iend;
  BYTE *anchor;
  size_t dictDelta;
  BYTE *dictEnd_1;
  BYTE *dictionary;
  BYTE *lowRefLimit;
  BYTE *lowLimit;
  BYTE *base;
  BYTE *ip;
  LZ4_stream_t_internal *dictPtr;
  int local_c;
  
  pBVar8 = (BYTE *)(LZ4_stream->table[0x801] + (ulong)(uint)LZ4_stream->table[0x803]);
  if (*(int *)((long)LZ4_stream->table + 0x4004) == 0) {
    sourceEnd = (BYTE *)source;
    if (((int)LZ4_stream->table[0x803] != 0) && (sourceEnd = (BYTE *)source, pBVar8 < source)) {
      sourceEnd = pBVar8;
    }
    LZ4_renormDictT((LZ4_stream_t_internal *)LZ4_stream,sourceEnd);
    streamPtr._4_4_ = acceleration;
    if (acceleration < 1) {
      streamPtr._4_4_ = 1;
    }
    pBVar9 = (BYTE *)(source + inputSize);
    if (((BYTE *)LZ4_stream->table[0x801] < pBVar9) && (pBVar9 < pBVar8)) {
      *(int *)(LZ4_stream->table + 0x803) = (int)pBVar8 - (int)pBVar9;
      if (0x10000 < (uint)LZ4_stream->table[0x803]) {
        *(undefined4 *)(LZ4_stream->table + 0x803) = 0x10000;
      }
      if ((uint)LZ4_stream->table[0x803] < 4) {
        *(undefined4 *)(LZ4_stream->table + 0x803) = 0;
      }
      LZ4_stream->table[0x801] = (long)pBVar8 - (ulong)(uint)LZ4_stream->table[0x803];
    }
    local_c = (int)dest;
    if (pBVar8 == (BYTE *)source) {
      if (((uint)LZ4_stream->table[0x803] < 0x10000) &&
         ((uint)LZ4_stream->table[0x803] < (uint)LZ4_stream->table[0x800])) {
        lVar1 = LZ4_stream->table[0x803];
        if ((uint)inputSize < 0x7e000001) {
          pBVar8 = (BYTE *)(source + -(ulong)(uint)LZ4_stream->table[0x800]);
          lVar2 = LZ4_stream->table[0x803];
          olimit = (BYTE *)dest;
          iend = (BYTE *)source;
          if (inputSize < 0xd) {
LAB_0025a04a:
            pcVar10 = source + ((long)inputSize - (long)iend);
            if ((BYTE *)(ulong)(uint)maxOutputSize <
                olimit + (long)(pcVar10 + (ulong)(pcVar10 + 0xf0) / 0xff + (1 - (long)dest))) {
              local_c = 0;
            }
            else {
              if (pcVar10 < (char *)0xf) {
                *olimit = (char)pcVar10 * '\x10';
                olimit = olimit + 1;
              }
              else {
                *olimit = 0xf0;
                pBVar8 = olimit;
                for (local_118 = pcVar10 + -0xf; olimit = pBVar8 + 1, (char *)0xfe < local_118;
                    local_118 = local_118 + -0xff) {
                  *olimit = 0xff;
                  pBVar8 = olimit;
                }
                *olimit = (BYTE)local_118;
                olimit = pBVar8 + 2;
              }
              memcpy(olimit,iend,(size_t)pcVar10);
              local_c = ((int)pcVar10 + (int)olimit) - local_c;
            }
          }
          else {
            LZ4_putPosition((BYTE *)source,LZ4_stream,byU32,pBVar8);
            base = (BYTE *)(source + 1);
            refDelta._4_4_ = LZ4_hashPosition(base,byU32);
            while( true ) {
              _searchMatchNb = base;
              h = 1;
              litLength = streamPtr._4_4_ << 6;
              do {
                base = _searchMatchNb;
                pBVar9 = _searchMatchNb + h;
                h = litLength >> 6;
                if (source + (long)inputSize + -0xc < pBVar9) goto LAB_0025a04a;
                token = LZ4_getPositionOnHash(refDelta._4_4_,LZ4_stream,byU32,pBVar8);
                UVar3 = LZ4_hashPosition(pBVar9,byU32);
                LZ4_putPositionOnHash(_searchMatchNb,refDelta._4_4_,LZ4_stream,byU32,pBVar8);
                bVar13 = true;
                if ((source + -(ulong)(uint)lVar1 <= token) &&
                   (bVar13 = true, _searchMatchNb <= token + 0xffff)) {
                  UVar4 = LZ4_read32(token);
                  UVar5 = LZ4_read32(_searchMatchNb);
                  bVar13 = UVar4 != UVar5;
                }
                litLength = litLength + 1;
                _searchMatchNb = pBVar9;
                refDelta._4_4_ = UVar3;
              } while (bVar13);
              while( true ) {
                bVar13 = false;
                if ((iend < base) && (bVar13 = false, source + -(ulong)(uint)lVar2 < token)) {
                  bVar13 = base[-1] == token[-1];
                }
                if (!bVar13) break;
                base = base + -1;
                token = token + -1;
              }
              uVar6 = (int)base - (int)iend;
              pBVar9 = olimit + 1;
              forwardIp = olimit;
              if (dest + maxOutputSize < pBVar9 + (ulong)uVar6 / 0xff + (ulong)uVar6 + 8) break;
              if (uVar6 < 0xf) {
                *olimit = (char)uVar6 * '\x10';
                olimit = pBVar9;
              }
              else {
                *olimit = 0xf0;
                olimit = pBVar9;
                for (limit._4_4_ = uVar6 - 0xf; 0xfe < limit._4_4_;
                    limit._4_4_ = limit._4_4_ + -0xff) {
                  *olimit = 0xff;
                  olimit = olimit + 1;
                }
                *olimit = (BYTE)limit._4_4_;
                olimit = olimit + 1;
              }
              LZ4_wildCopy(olimit,iend,olimit + uVar6);
              olimit = olimit + uVar6;
              while( true ) {
                LZ4_writeLE16(olimit,(short)base - (short)token);
                uVar6 = LZ4_count(base + 4,token + 4,(BYTE *)(source + (long)inputSize + -5));
                iend = base + (uVar6 + 4);
                if (dest + maxOutputSize < olimit + (ulong)(uVar6 >> 8) + 8) {
                  local_c = 0;
                  goto LAB_0025a1bd;
                }
                if (uVar6 < 0xf) {
                  *forwardIp = *forwardIp + (char)uVar6;
                  olimit = olimit + 2;
                }
                else {
                  *forwardIp = *forwardIp + '\x0f';
                  olimit = olimit + 2;
                  for (limit._0_4_ = uVar6 - 0xf; 0x1fd < (uint)limit;
                      limit._0_4_ = (uint)limit - 0x1fe) {
                    pBVar9 = olimit + 1;
                    *olimit = 0xff;
                    olimit = olimit + 2;
                    *pBVar9 = 0xff;
                  }
                  if (0xfe < (uint)limit) {
                    limit._0_4_ = (uint)limit - 0xff;
                    *olimit = 0xff;
                    olimit = olimit + 1;
                  }
                  *olimit = (BYTE)(uint)limit;
                  olimit = olimit + 1;
                }
                if (source + (long)inputSize + -0xc < iend) goto LAB_0025a04a;
                LZ4_putPosition(iend + -2,LZ4_stream,byU32,pBVar8);
                token = LZ4_getPosition(iend,LZ4_stream,byU32,pBVar8);
                LZ4_putPosition(iend,LZ4_stream,byU32,pBVar8);
                if ((token < source + -(ulong)(uint)lVar1) || (token + 0xffff < iend)) break;
                UVar3 = LZ4_read32(token);
                UVar4 = LZ4_read32(iend);
                if (UVar3 != UVar4) break;
                forwardIp = olimit;
                *olimit = '\0';
                olimit = olimit + 1;
                base = iend;
              }
              base = iend + 1;
              refDelta._4_4_ = LZ4_hashPosition(base,byU32);
            }
            local_c = 0;
          }
        }
        else {
          local_c = 0;
        }
LAB_0025a1bd:
        local_49c = local_c;
      }
      else {
        if ((uint)inputSize < 0x7e000001) {
          pBVar8 = (BYTE *)(source + -(ulong)(uint)LZ4_stream->table[0x800]);
          lVar1 = LZ4_stream->table[0x803];
          olimit_1 = (BYTE *)dest;
          iend_1 = (BYTE *)source;
          if (inputSize < 0xd) {
LAB_0025acc8:
            pcVar10 = source + ((long)inputSize - (long)iend_1);
            if ((BYTE *)(ulong)(uint)maxOutputSize <
                olimit_1 + (long)(pcVar10 + (ulong)(pcVar10 + 0xf0) / 0xff + (1 - (long)dest))) {
              local_11c = 0;
            }
            else {
              if (pcVar10 < (char *)0xf) {
                *olimit_1 = (char)pcVar10 * '\x10';
                olimit_1 = olimit_1 + 1;
              }
              else {
                *olimit_1 = 0xf0;
                pBVar8 = olimit_1;
                for (local_228 = pcVar10 + -0xf; olimit_1 = pBVar8 + 1, (char *)0xfe < local_228;
                    local_228 = local_228 + -0xff) {
                  *olimit_1 = 0xff;
                  pBVar8 = olimit_1;
                }
                *olimit_1 = (BYTE)local_228;
                olimit_1 = pBVar8 + 2;
              }
              memcpy(olimit_1,iend_1,(size_t)pcVar10);
              local_11c = ((int)pcVar10 + (int)olimit_1) - local_c;
            }
          }
          else {
            LZ4_putPosition((BYTE *)source,LZ4_stream,byU32,pBVar8);
            base_1 = (BYTE *)(source + 1);
            refDelta_1._4_4_ = LZ4_hashPosition(base_1,byU32);
            while( true ) {
              _searchMatchNb_1 = base_1;
              h_1 = 1;
              litLength_1 = streamPtr._4_4_ << 6;
              do {
                base_1 = _searchMatchNb_1;
                pBVar9 = _searchMatchNb_1 + h_1;
                h_1 = litLength_1 >> 6;
                if (source + (long)inputSize + -0xc < pBVar9) goto LAB_0025acc8;
                token_1 = LZ4_getPositionOnHash(refDelta_1._4_4_,LZ4_stream,byU32,pBVar8);
                UVar3 = LZ4_hashPosition(pBVar9,byU32);
                LZ4_putPositionOnHash(_searchMatchNb_1,refDelta_1._4_4_,LZ4_stream,byU32,pBVar8);
                bVar13 = true;
                if (_searchMatchNb_1 <= token_1 + 0xffff) {
                  UVar4 = LZ4_read32(token_1);
                  UVar5 = LZ4_read32(_searchMatchNb_1);
                  bVar13 = UVar4 != UVar5;
                }
                litLength_1 = litLength_1 + 1;
                _searchMatchNb_1 = pBVar9;
                refDelta_1._4_4_ = UVar3;
              } while (bVar13);
              while( true ) {
                bVar13 = false;
                if ((iend_1 < base_1) && (bVar13 = false, source + -(ulong)(uint)lVar1 < token_1)) {
                  bVar13 = base_1[-1] == token_1[-1];
                }
                if (!bVar13) break;
                base_1 = base_1 + -1;
                token_1 = token_1 + -1;
              }
              uVar6 = (int)base_1 - (int)iend_1;
              pBVar9 = olimit_1 + 1;
              forwardIp_1 = olimit_1;
              if (dest + maxOutputSize < pBVar9 + (ulong)uVar6 / 0xff + (ulong)uVar6 + 8) break;
              if (uVar6 < 0xf) {
                *olimit_1 = (char)uVar6 * '\x10';
                olimit_1 = pBVar9;
              }
              else {
                *olimit_1 = 0xf0;
                olimit_1 = pBVar9;
                for (limit_1._4_4_ = uVar6 - 0xf; 0xfe < limit_1._4_4_;
                    limit_1._4_4_ = limit_1._4_4_ + -0xff) {
                  *olimit_1 = 0xff;
                  olimit_1 = olimit_1 + 1;
                }
                *olimit_1 = (BYTE)limit_1._4_4_;
                olimit_1 = olimit_1 + 1;
              }
              LZ4_wildCopy(olimit_1,iend_1,olimit_1 + uVar6);
              olimit_1 = olimit_1 + uVar6;
              while( true ) {
                LZ4_writeLE16(olimit_1,(short)base_1 - (short)token_1);
                uVar6 = LZ4_count(base_1 + 4,token_1 + 4,(BYTE *)(source + (long)inputSize + -5));
                iend_1 = base_1 + (uVar6 + 4);
                if (dest + maxOutputSize < olimit_1 + (ulong)(uVar6 >> 8) + 8) {
                  local_11c = 0;
                  goto LAB_0025ae4d;
                }
                if (uVar6 < 0xf) {
                  *forwardIp_1 = *forwardIp_1 + (char)uVar6;
                  olimit_1 = olimit_1 + 2;
                }
                else {
                  *forwardIp_1 = *forwardIp_1 + '\x0f';
                  olimit_1 = olimit_1 + 2;
                  for (limit_1._0_4_ = uVar6 - 0xf; 0x1fd < (uint)limit_1;
                      limit_1._0_4_ = (uint)limit_1 - 0x1fe) {
                    pBVar9 = olimit_1 + 1;
                    *olimit_1 = 0xff;
                    olimit_1 = olimit_1 + 2;
                    *pBVar9 = 0xff;
                  }
                  if (0xfe < (uint)limit_1) {
                    limit_1._0_4_ = (uint)limit_1 - 0xff;
                    *olimit_1 = 0xff;
                    olimit_1 = olimit_1 + 1;
                  }
                  *olimit_1 = (BYTE)(uint)limit_1;
                  olimit_1 = olimit_1 + 1;
                }
                if (source + (long)inputSize + -0xc < iend_1) goto LAB_0025acc8;
                LZ4_putPosition(iend_1 + -2,LZ4_stream,byU32,pBVar8);
                token_1 = LZ4_getPosition(iend_1,LZ4_stream,byU32,pBVar8);
                LZ4_putPosition(iend_1,LZ4_stream,byU32,pBVar8);
                if (token_1 + 0xffff < iend_1) break;
                UVar3 = LZ4_read32(token_1);
                UVar4 = LZ4_read32(iend_1);
                if (UVar3 != UVar4) break;
                forwardIp_1 = olimit_1;
                *olimit_1 = '\0';
                olimit_1 = olimit_1 + 1;
                base_1 = iend_1;
              }
              base_1 = iend_1 + 1;
              refDelta_1._4_4_ = LZ4_hashPosition(base_1,byU32);
            }
            local_11c = 0;
          }
        }
        else {
          local_11c = 0;
        }
LAB_0025ae4d:
        local_49c = local_11c;
      }
      *(int *)(LZ4_stream->table + 0x803) = inputSize + (int)LZ4_stream->table[0x803];
      *(int *)(LZ4_stream->table + 0x800) = inputSize + (int)LZ4_stream->table[0x800];
      LZ4_stream_local._4_4_ = local_49c;
    }
    else {
      if (((uint)LZ4_stream->table[0x803] < 0x10000) &&
         ((uint)LZ4_stream->table[0x803] < (uint)LZ4_stream->table[0x800])) {
        lVar1 = LZ4_stream->table[0x803];
        pBVar8 = (BYTE *)LZ4_stream->table[0x801];
        uVar6 = (uint)LZ4_stream->table[0x803];
        pBVar9 = (BYTE *)(source + (long)inputSize + -5);
        if ((uint)inputSize < 0x7e000001) {
          pBVar11 = (BYTE *)(source + -(ulong)(uint)LZ4_stream->table[0x800]);
          olimit_2 = (BYTE *)dest;
          iend_2 = (BYTE *)source;
          if (inputSize < 0xd) {
LAB_0025b9d0:
            pcVar10 = source + ((long)inputSize - (long)iend_2);
            if ((BYTE *)(ulong)(uint)maxOutputSize <
                olimit_2 + (long)(pcVar10 + (ulong)(pcVar10 + 0xf0) / 0xff + (1 - (long)dest))) {
              local_22c = 0;
            }
            else {
              if (pcVar10 < (char *)0xf) {
                *olimit_2 = (char)pcVar10 * '\x10';
                olimit_2 = olimit_2 + 1;
              }
              else {
                *olimit_2 = 0xf0;
                pBVar8 = olimit_2;
                for (local_338 = pcVar10 + -0xf; olimit_2 = pBVar8 + 1, (char *)0xfe < local_338;
                    local_338 = local_338 + -0xff) {
                  *olimit_2 = 0xff;
                  pBVar8 = olimit_2;
                }
                *olimit_2 = (BYTE)local_338;
                olimit_2 = pBVar8 + 2;
              }
              memcpy(olimit_2,iend_2,(size_t)pcVar10);
              local_22c = ((int)pcVar10 + (int)olimit_2) - local_c;
            }
          }
          else {
            LZ4_putPosition((BYTE *)source,LZ4_stream,byU32,pBVar11);
            base_2 = (BYTE *)(source + 1);
            refDelta_2._4_4_ = LZ4_hashPosition(base_2,byU32);
            while( true ) {
              _searchMatchNb_2 = base_2;
              h_2 = 1;
              litLength_2 = streamPtr._4_4_ << 6;
              do {
                base_2 = _searchMatchNb_2;
                pBVar12 = _searchMatchNb_2 + h_2;
                h_2 = litLength_2 >> 6;
                if (source + (long)inputSize + -0xc < pBVar12) goto LAB_0025b9d0;
                token_2 = LZ4_getPositionOnHash(refDelta_2._4_4_,LZ4_stream,byU32,pBVar11);
                match_2 = pBVar8 + ((ulong)uVar6 - (long)source);
                lowRefLimit_2 = pBVar8;
                if (source <= token_2) {
                  match_2 = (BYTE *)0x0;
                  lowRefLimit_2 = (BYTE *)source;
                }
                UVar3 = LZ4_hashPosition(pBVar12,byU32);
                LZ4_putPositionOnHash(_searchMatchNb_2,refDelta_2._4_4_,LZ4_stream,byU32,pBVar11);
                bVar13 = true;
                if ((source + -(ulong)(uint)lVar1 <= token_2) &&
                   (bVar13 = true, _searchMatchNb_2 <= token_2 + 0xffff)) {
                  UVar4 = LZ4_read32(token_2 + (long)match_2);
                  UVar5 = LZ4_read32(_searchMatchNb_2);
                  bVar13 = UVar4 != UVar5;
                }
                litLength_2 = litLength_2 + 1;
                _searchMatchNb_2 = pBVar12;
                refDelta_2._4_4_ = UVar3;
              } while (bVar13);
              while( true ) {
                bVar13 = false;
                if ((iend_2 < base_2) && (bVar13 = false, lowRefLimit_2 < token_2 + (long)match_2))
                {
                  bVar13 = base_2[-1] == token_2[(long)(match_2 + -1)];
                }
                if (!bVar13) break;
                base_2 = base_2 + -1;
                token_2 = token_2 + -1;
              }
              uVar7 = (int)base_2 - (int)iend_2;
              pBVar12 = olimit_2 + 1;
              forwardIp_2 = olimit_2;
              if (dest + maxOutputSize < pBVar12 + (ulong)uVar7 / 0xff + (ulong)uVar7 + 8) break;
              if (uVar7 < 0xf) {
                *olimit_2 = (char)uVar7 * '\x10';
                olimit_2 = pBVar12;
              }
              else {
                *olimit_2 = 0xf0;
                olimit_2 = pBVar12;
                for (limit_2._4_4_ = uVar7 - 0xf; 0xfe < limit_2._4_4_;
                    limit_2._4_4_ = limit_2._4_4_ + -0xff) {
                  *olimit_2 = 0xff;
                  olimit_2 = olimit_2 + 1;
                }
                *olimit_2 = (BYTE)limit_2._4_4_;
                olimit_2 = olimit_2 + 1;
              }
              LZ4_wildCopy(olimit_2,iend_2,olimit_2 + uVar7);
              olimit_2 = olimit_2 + uVar7;
              while( true ) {
                LZ4_writeLE16(olimit_2,(short)base_2 - (short)token_2);
                if (lowRefLimit_2 == pBVar8) {
                  pBStack_320 = base_2 + (long)(pBVar8 + ((ulong)uVar6 -
                                                         (long)(match_2 + (long)token_2)));
                  if (pBVar9 < base_2 + (long)(pBVar8 + ((ulong)uVar6 -
                                                        (long)(match_2 + (long)token_2)))) {
                    pBStack_320 = pBVar9;
                  }
                  limit_2._0_4_ = LZ4_count(base_2 + 4,match_2 + (long)token_2 + 4,pBStack_320);
                  base_2 = base_2 + ((uint)limit_2 + 4);
                  if (base_2 == pBStack_320) {
                    uVar7 = LZ4_count(base_2,(BYTE *)source,pBVar9);
                    limit_2._0_4_ = uVar7 + (uint)limit_2;
                    base_2 = base_2 + uVar7;
                  }
                }
                else {
                  limit_2._0_4_ = LZ4_count(base_2 + 4,token_2 + 4,pBVar9);
                  base_2 = base_2 + ((uint)limit_2 + 4);
                }
                if (dest + maxOutputSize < olimit_2 + (ulong)((uint)limit_2 >> 8) + 8) {
                  local_22c = 0;
                  goto LAB_0025bb55;
                }
                if ((uint)limit_2 < 0xf) {
                  *forwardIp_2 = *forwardIp_2 + (char)(uint)limit_2;
                  olimit_2 = olimit_2 + 2;
                }
                else {
                  *forwardIp_2 = *forwardIp_2 + '\x0f';
                  olimit_2 = olimit_2 + 2;
                  for (limit_2._0_4_ = (uint)limit_2 - 0xf; 0x1fd < (uint)limit_2;
                      limit_2._0_4_ = (uint)limit_2 - 0x1fe) {
                    pBVar12 = olimit_2 + 1;
                    *olimit_2 = 0xff;
                    olimit_2 = olimit_2 + 2;
                    *pBVar12 = 0xff;
                  }
                  if (0xfe < (uint)limit_2) {
                    limit_2._0_4_ = (uint)limit_2 - 0xff;
                    *olimit_2 = 0xff;
                    olimit_2 = olimit_2 + 1;
                  }
                  *olimit_2 = (BYTE)(uint)limit_2;
                  olimit_2 = olimit_2 + 1;
                }
                iend_2 = base_2;
                if (source + (long)inputSize + -0xc < base_2) goto LAB_0025b9d0;
                LZ4_putPosition(base_2 + -2,LZ4_stream,byU32,pBVar11);
                token_2 = LZ4_getPosition(base_2,LZ4_stream,byU32,pBVar11);
                match_2 = pBVar8 + ((ulong)uVar6 - (long)source);
                lowRefLimit_2 = pBVar8;
                if (source <= token_2) {
                  match_2 = (BYTE *)0x0;
                  lowRefLimit_2 = (BYTE *)source;
                }
                LZ4_putPosition(base_2,LZ4_stream,byU32,pBVar11);
                if ((token_2 < source + -(ulong)(uint)lVar1) || (token_2 + 0xffff < base_2)) break;
                UVar3 = LZ4_read32(token_2 + (long)match_2);
                UVar4 = LZ4_read32(base_2);
                if (UVar3 != UVar4) break;
                forwardIp_2 = olimit_2;
                *olimit_2 = '\0';
                olimit_2 = olimit_2 + 1;
              }
              base_2 = base_2 + 1;
              refDelta_2._4_4_ = LZ4_hashPosition(base_2,byU32);
            }
            local_22c = 0;
          }
        }
        else {
          local_22c = 0;
        }
LAB_0025bb55:
        local_4a0 = local_22c;
      }
      else {
        pBVar8 = (BYTE *)LZ4_stream->table[0x801];
        uVar6 = (uint)LZ4_stream->table[0x803];
        pBVar9 = (BYTE *)(source + (long)inputSize + -5);
        if ((uint)inputSize < 0x7e000001) {
          pBVar11 = (BYTE *)(source + -(ulong)(uint)LZ4_stream->table[0x800]);
          olimit_3 = (BYTE *)dest;
          iend_3 = (BYTE *)source;
          if (inputSize < 0xd) {
LAB_0025c663:
            pcVar10 = source + ((long)inputSize - (long)iend_3);
            if ((BYTE *)(ulong)(uint)maxOutputSize <
                olimit_3 + (long)(pcVar10 + (ulong)(pcVar10 + 0xf0) / 0xff + (1 - (long)dest))) {
              local_33c = 0;
            }
            else {
              if (pcVar10 < (char *)0xf) {
                *olimit_3 = (char)pcVar10 * '\x10';
                olimit_3 = olimit_3 + 1;
              }
              else {
                *olimit_3 = 0xf0;
                pBVar8 = olimit_3;
                for (local_448 = pcVar10 + -0xf; olimit_3 = pBVar8 + 1, (char *)0xfe < local_448;
                    local_448 = local_448 + -0xff) {
                  *olimit_3 = 0xff;
                  pBVar8 = olimit_3;
                }
                *olimit_3 = (BYTE)local_448;
                olimit_3 = pBVar8 + 2;
              }
              memcpy(olimit_3,iend_3,(size_t)pcVar10);
              local_33c = ((int)pcVar10 + (int)olimit_3) - local_c;
            }
          }
          else {
            LZ4_putPosition((BYTE *)source,LZ4_stream,byU32,pBVar11);
            base_3 = (BYTE *)(source + 1);
            refDelta_3._4_4_ = LZ4_hashPosition(base_3,byU32);
            while( true ) {
              _searchMatchNb_3 = base_3;
              h_3 = 1;
              litLength_3 = streamPtr._4_4_ << 6;
              do {
                base_3 = _searchMatchNb_3;
                pBVar12 = _searchMatchNb_3 + h_3;
                h_3 = litLength_3 >> 6;
                if (source + (long)inputSize + -0xc < pBVar12) goto LAB_0025c663;
                token_3 = LZ4_getPositionOnHash(refDelta_3._4_4_,LZ4_stream,byU32,pBVar11);
                match_3 = pBVar8 + ((ulong)uVar6 - (long)source);
                lowRefLimit_3 = pBVar8;
                if (source <= token_3) {
                  match_3 = (BYTE *)0x0;
                  lowRefLimit_3 = (BYTE *)source;
                }
                UVar3 = LZ4_hashPosition(pBVar12,byU32);
                LZ4_putPositionOnHash(_searchMatchNb_3,refDelta_3._4_4_,LZ4_stream,byU32,pBVar11);
                bVar13 = true;
                if (_searchMatchNb_3 <= token_3 + 0xffff) {
                  UVar4 = LZ4_read32(token_3 + (long)match_3);
                  UVar5 = LZ4_read32(_searchMatchNb_3);
                  bVar13 = UVar4 != UVar5;
                }
                litLength_3 = litLength_3 + 1;
                _searchMatchNb_3 = pBVar12;
                refDelta_3._4_4_ = UVar3;
              } while (bVar13);
              while( true ) {
                bVar13 = false;
                if ((iend_3 < base_3) && (bVar13 = false, lowRefLimit_3 < token_3 + (long)match_3))
                {
                  bVar13 = base_3[-1] == token_3[(long)(match_3 + -1)];
                }
                if (!bVar13) break;
                base_3 = base_3 + -1;
                token_3 = token_3 + -1;
              }
              uVar7 = (int)base_3 - (int)iend_3;
              pBVar12 = olimit_3 + 1;
              forwardIp_3 = olimit_3;
              if (dest + maxOutputSize < pBVar12 + (ulong)uVar7 / 0xff + (ulong)uVar7 + 8) break;
              if (uVar7 < 0xf) {
                *olimit_3 = (char)uVar7 * '\x10';
                olimit_3 = pBVar12;
              }
              else {
                *olimit_3 = 0xf0;
                olimit_3 = pBVar12;
                for (limit_3._4_4_ = uVar7 - 0xf; 0xfe < limit_3._4_4_;
                    limit_3._4_4_ = limit_3._4_4_ + -0xff) {
                  *olimit_3 = 0xff;
                  olimit_3 = olimit_3 + 1;
                }
                *olimit_3 = (BYTE)limit_3._4_4_;
                olimit_3 = olimit_3 + 1;
              }
              LZ4_wildCopy(olimit_3,iend_3,olimit_3 + uVar7);
              olimit_3 = olimit_3 + uVar7;
              while( true ) {
                LZ4_writeLE16(olimit_3,(short)base_3 - (short)token_3);
                if (lowRefLimit_3 == pBVar8) {
                  pBStack_430 = base_3 + (long)(pBVar8 + ((ulong)uVar6 -
                                                         (long)(match_3 + (long)token_3)));
                  if (pBVar9 < base_3 + (long)(pBVar8 + ((ulong)uVar6 -
                                                        (long)(match_3 + (long)token_3)))) {
                    pBStack_430 = pBVar9;
                  }
                  limit_3._0_4_ = LZ4_count(base_3 + 4,match_3 + (long)token_3 + 4,pBStack_430);
                  base_3 = base_3 + ((uint)limit_3 + 4);
                  if (base_3 == pBStack_430) {
                    uVar7 = LZ4_count(base_3,(BYTE *)source,pBVar9);
                    limit_3._0_4_ = uVar7 + (uint)limit_3;
                    base_3 = base_3 + uVar7;
                  }
                }
                else {
                  limit_3._0_4_ = LZ4_count(base_3 + 4,token_3 + 4,pBVar9);
                  base_3 = base_3 + ((uint)limit_3 + 4);
                }
                if (dest + maxOutputSize < olimit_3 + (ulong)((uint)limit_3 >> 8) + 8) {
                  local_33c = 0;
                  goto LAB_0025c7e8;
                }
                if ((uint)limit_3 < 0xf) {
                  *forwardIp_3 = *forwardIp_3 + (char)(uint)limit_3;
                  olimit_3 = olimit_3 + 2;
                }
                else {
                  *forwardIp_3 = *forwardIp_3 + '\x0f';
                  olimit_3 = olimit_3 + 2;
                  for (limit_3._0_4_ = (uint)limit_3 - 0xf; 0x1fd < (uint)limit_3;
                      limit_3._0_4_ = (uint)limit_3 - 0x1fe) {
                    pBVar12 = olimit_3 + 1;
                    *olimit_3 = 0xff;
                    olimit_3 = olimit_3 + 2;
                    *pBVar12 = 0xff;
                  }
                  if (0xfe < (uint)limit_3) {
                    limit_3._0_4_ = (uint)limit_3 - 0xff;
                    *olimit_3 = 0xff;
                    olimit_3 = olimit_3 + 1;
                  }
                  *olimit_3 = (BYTE)(uint)limit_3;
                  olimit_3 = olimit_3 + 1;
                }
                iend_3 = base_3;
                if (source + (long)inputSize + -0xc < base_3) goto LAB_0025c663;
                LZ4_putPosition(base_3 + -2,LZ4_stream,byU32,pBVar11);
                token_3 = LZ4_getPosition(base_3,LZ4_stream,byU32,pBVar11);
                match_3 = pBVar8 + ((ulong)uVar6 - (long)source);
                lowRefLimit_3 = pBVar8;
                if (source <= token_3) {
                  match_3 = (BYTE *)0x0;
                  lowRefLimit_3 = (BYTE *)source;
                }
                LZ4_putPosition(base_3,LZ4_stream,byU32,pBVar11);
                if (token_3 + 0xffff < base_3) break;
                UVar3 = LZ4_read32(token_3 + (long)match_3);
                UVar4 = LZ4_read32(base_3);
                if (UVar3 != UVar4) break;
                forwardIp_3 = olimit_3;
                *olimit_3 = '\0';
                olimit_3 = olimit_3 + 1;
              }
              base_3 = base_3 + 1;
              refDelta_3._4_4_ = LZ4_hashPosition(base_3,byU32);
            }
            local_33c = 0;
          }
        }
        else {
          local_33c = 0;
        }
LAB_0025c7e8:
        local_4a0 = local_33c;
      }
      LZ4_stream->table[0x801] = (longlong)source;
      *(int *)(LZ4_stream->table + 0x803) = inputSize;
      *(int *)(LZ4_stream->table + 0x800) = inputSize + (int)LZ4_stream->table[0x800];
      LZ4_stream_local._4_4_ = local_4a0;
    }
  }
  else {
    LZ4_stream_local._4_4_ = 0;
  }
  return LZ4_stream_local._4_4_;
}

Assistant:

int LZ4_compress_fast_continue (LZ4_stream_t* LZ4_stream, const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t_internal* streamPtr = (LZ4_stream_t_internal*)LZ4_stream;
    const BYTE* const dictEnd = streamPtr->dictionary + streamPtr->dictSize;

    const BYTE* smallest = (const BYTE*) source;
    if (streamPtr->initCheck) return 0;   /* Uninitialized structure detected */
    if ((streamPtr->dictSize>0) && (smallest>dictEnd)) smallest = dictEnd;
    LZ4_renormDictT(streamPtr, smallest);
    if (acceleration < 1) acceleration = ACCELERATION_DEFAULT;

    /* Check overlapping input/dictionary space */
    {
        const BYTE* sourceEnd = (const BYTE*) source + inputSize;
        if ((sourceEnd > streamPtr->dictionary) && (sourceEnd < dictEnd))
        {
            streamPtr->dictSize = (U32)(dictEnd - sourceEnd);
            if (streamPtr->dictSize > 64 KB) streamPtr->dictSize = 64 KB;
            if (streamPtr->dictSize < 4) streamPtr->dictSize = 0;
            streamPtr->dictionary = dictEnd - streamPtr->dictSize;
        }
    }

    /* prefix mode : source data follows dictionary */
    if (dictEnd == (const BYTE*)source)
    {
        int result;
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            result = LZ4_compress_generic(LZ4_stream, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, withPrefix64k, dictSmall, acceleration);
        else
            result = LZ4_compress_generic(LZ4_stream, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, withPrefix64k, noDictIssue, acceleration);
        streamPtr->dictSize += (U32)inputSize;
        streamPtr->currentOffset += (U32)inputSize;
        return result;
    }

    /* external dictionary mode */
    {
        int result;
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            result = LZ4_compress_generic(LZ4_stream, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, usingExtDict, dictSmall, acceleration);
        else
            result = LZ4_compress_generic(LZ4_stream, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, usingExtDict, noDictIssue, acceleration);
        streamPtr->dictionary = (const BYTE*)source;
        streamPtr->dictSize = (U32)inputSize;
        streamPtr->currentOffset += (U32)inputSize;
        return result;
    }
}